

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  int number;
  uint32_t uVar2;
  Descriptor *pDVar3;
  MessageLite *pMVar4;
  Message **ppMVar5;
  Message *pMVar6;
  Nonnull<const_char_*> pcVar7;
  bool bVar8;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar9;
  
  MVar9 = Message::GetMetadata(message);
  if (MVar9.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar9 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar9.descriptor,field,"GetMessage");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar1 = field->field_0x1;
    bVar8 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar8) {
      pcVar7 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar8,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar7 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) != 0) {
          if (factory == (MessageFactory *)0x0) {
            factory = this->message_factory_;
          }
          uVar2 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          number = field->number_;
          pDVar3 = FieldDescriptor::message_type(field);
          pMVar4 = protobuf::internal::ExtensionSet::GetMessage
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,number,pDVar3,factory);
          return (Message *)pMVar4;
        }
        bVar8 = protobuf::internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar8) {
          if ((field->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = (field->scope_).containing_oneof;
            if (oneof_descriptor == (OneofDescriptor *)0x0) {
              protobuf::internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb31);
            }
          }
          uVar2 = GetOneofCase(this,message,oneof_descriptor);
          if (uVar2 != field->number_) goto LAB_00fa2f39;
        }
        ppMVar5 = GetRaw<google::protobuf::Message_const*>(this,message,field);
        if (*ppMVar5 != (Message *)0x0) {
          return *ppMVar5;
        }
LAB_00fa2f39:
        pMVar6 = GetDefaultMessageInstance(this,field);
        return pMVar6;
      }
    }
    else {
      GetMessage();
    }
    pDVar3 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"GetMessage",description);
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return *GetDefaultMessageInstance(field);
    }
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = GetDefaultMessageInstance(field);
    }
    return *result;
  }
}